

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

MutableStringView __thiscall
Corrade::Containers::String::trimmedSuffix(String *this,StringView characters)

{
  StringView characters_00;
  BasicStringView<char> BVar1;
  MutableStringView MVar2;
  BasicStringView<char> local_40;
  String *local_30;
  String *this_local;
  StringView characters_local;
  
  characters_local._data = (char *)characters._sizePlusFlags;
  this_local = (String *)characters._data;
  local_30 = this;
  BasicStringView<char>::BasicStringView(&local_40,this);
  characters_00._sizePlusFlags = (size_t)characters_local._data;
  characters_00._data = (char *)this_local;
  BVar1 = BasicStringView<char>::trimmedSuffix(&local_40,characters_00);
  MVar2._data = BVar1._data;
  MVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return MVar2;
}

Assistant:

MutableStringView String::trimmedSuffix(const StringView characters) {
    return MutableStringView{*this}.trimmedSuffix(characters);
}